

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnenum * rnn_findenum(rnndb *db,char *name)

{
  rnnenum *prVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)db->enumsnum;
  if (db->enumsnum < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 == uVar4) {
      return (rnnenum *)0x0;
    }
    prVar1 = db->enums[uVar4];
    iVar2 = strcmp(prVar1->name,name);
    uVar4 = uVar4 + 1;
  } while (iVar2 != 0);
  return prVar1;
}

Assistant:

struct rnnenum *rnn_findenum (struct rnndb *db, const char *name) {
	int i;
	for (i = 0; i < db->enumsnum; i++)
		if (!strcmp(db->enums[i]->name, name))
			return db->enums[i];
	return 0;
}